

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::WriteLevel0Table(DBImpl *this,MemTable *mem,VersionEdit *edit,Version *base)

{
  Logger *info_log;
  undefined8 uVar1;
  uint64_t uVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  Version *in_R8;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar6;
  undefined1 local_118 [8];
  CompactionStats stats;
  Slice max_user_key;
  Slice min_user_key;
  undefined1 local_d8 [4];
  int level;
  Status local_b8;
  undefined1 local_a9;
  Iterator *local_a8;
  Iterator *iter;
  undefined1 local_98;
  undefined1 local_90 [8];
  FileMetaData meta;
  uint64_t start_micros;
  Version *base_local;
  VersionEdit *edit_local;
  MemTable *mem_local;
  DBImpl *this_local;
  Status *s;
  
  port::Mutex::AssertHeld((Mutex *)&mem[1].table_.arena_);
  iVar4 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x15])();
  meta.largest.rep_.field_2._8_8_ = CONCAT44(extraout_var,iVar4);
  FileMetaData::FileMetaData((FileMetaData *)local_90);
  meta._0_8_ = VersionSet::NewFileNumber(*(VersionSet **)&mem[4].table_.max_height_);
  pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&mem[4].arena_.blocks_,(value_type_conflict *)&meta);
  iter = (Iterator *)pVar6.first._M_node;
  local_98 = pVar6.second;
  local_a8 = MemTable::NewIterator((MemTable *)edit);
  Log((Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator,
      "Level-0 table #%llu: started",meta._0_8_);
  local_a9 = 0;
  Status::Status((Status *)this);
  port::Mutex::Unlock((Mutex *)&mem[1].table_.arena_);
  BuildTable((leveldb *)&local_b8,(string *)&mem[1].arena_.blocks_,
             (Env *)(mem->comparator_).comparator.user_comparator_,
             (Options *)
             &(mem->arena_).blocks_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_finish,
             (TableCache *)mem[1].table_.compare_.comparator.super_Comparator._vptr_Comparator,
             local_a8,(FileMetaData *)local_90);
  Status::operator=((Status *)this,&local_b8);
  Status::~Status(&local_b8);
  port::Mutex::Lock((Mutex *)&mem[1].table_.arena_);
  uVar2 = meta.number;
  uVar1 = meta._0_8_;
  info_log = (Logger *)(mem->table_).compare_.comparator.super_Comparator._vptr_Comparator;
  Status::ToString_abi_cxx11_((string *)local_d8,(Status *)this);
  uVar5 = std::__cxx11::string::c_str();
  Log(info_log,"Level-0 table #%llu: %lld bytes %s",uVar1,uVar2,uVar5);
  std::__cxx11::string::~string((string *)local_d8);
  if (local_a8 != (Iterator *)0x0) {
    (*local_a8->_vptr_Iterator[1])();
  }
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             &mem[4].arena_.blocks_,(key_type *)&meta);
  min_user_key.size_._4_4_ = 0;
  bVar3 = Status::ok((Status *)this);
  if ((bVar3) && (meta.number != 0)) {
    join_0x00000010_0x00000000_ = InternalKey::user_key((InternalKey *)&meta.file_size);
    join_0x00000010_0x00000000_ =
         InternalKey::user_key((InternalKey *)((long)&meta.smallest.rep_.field_2 + 8));
    if (in_R8 != (Version *)0x0) {
      min_user_key.size_._4_4_ =
           Version::PickLevelForMemTableOutput
                     (in_R8,(Slice *)&max_user_key.size_,(Slice *)&stats.bytes_written);
    }
    VersionEdit::AddFile
              ((VersionEdit *)base,min_user_key.size_._4_4_,meta._0_8_,meta.number,
               (InternalKey *)&meta.file_size,(InternalKey *)((long)&meta.smallest.rep_.field_2 + 8)
              );
  }
  CompactionStats::CompactionStats((CompactionStats *)local_118);
  iVar4 = (*((mem->comparator_).comparator.user_comparator_)->_vptr_Comparator[0x15])();
  local_118 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar4) - meta.largest.rep_.field_2._8_8_);
  stats.bytes_read = meta.number;
  CompactionStats::Add
            ((CompactionStats *)
             ((long)&mem[5].comparator_ + (long)min_user_key.size_._4_4_ * 0x18 + 8),
             (CompactionStats *)local_118);
  local_a9 = 1;
  FileMetaData::~FileMetaData((FileMetaData *)local_90);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::WriteLevel0Table(MemTable* mem, VersionEdit* edit,
                                Version* base) {
  mutex_.AssertHeld();
  const uint64_t start_micros = env_->NowMicros();
  FileMetaData meta;
  meta.number = versions_->NewFileNumber();
  pending_outputs_.insert(meta.number);
  Iterator* iter = mem->NewIterator();
  Log(options_.info_log, "Level-0 table #%llu: started",
      (unsigned long long)meta.number);

  Status s;
  {
    mutex_.Unlock();
    s = BuildTable(dbname_, env_, options_, table_cache_, iter, &meta);
    mutex_.Lock();
  }

  Log(options_.info_log, "Level-0 table #%llu: %lld bytes %s",
      (unsigned long long)meta.number, (unsigned long long)meta.file_size,
      s.ToString().c_str());
  delete iter;
  pending_outputs_.erase(meta.number);

  // Note that if file_size is zero, the file has been deleted and
  // should not be added to the manifest.
  int level = 0;
  if (s.ok() && meta.file_size > 0) {
    const Slice min_user_key = meta.smallest.user_key();
    const Slice max_user_key = meta.largest.user_key();
    if (base != nullptr) {
      level = base->PickLevelForMemTableOutput(min_user_key, max_user_key);
    }
    edit->AddFile(level, meta.number, meta.file_size, meta.smallest,
                  meta.largest);
  }

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros;
  stats.bytes_written = meta.file_size;
  stats_[level].Add(stats);
  return s;
}